

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O1

int CBB_add_asn1_element(CBB *cbb,CBS_ASN1_TAG tag,uint8_t *data,size_t data_len)

{
  int iVar1;
  anon_union_32_2_4f6aaa2e_for_u *paVar2;
  uint8_t *out;
  CBB child;
  uint8_t *local_58;
  CBB local_50;
  
  iVar1 = CBB_add_asn1(cbb,&local_50,tag);
  if (iVar1 != 0) {
    iVar1 = CBB_add_space(&local_50,&local_58,data_len);
    if (data_len != 0 && iVar1 != 0) {
      memcpy(local_58,data,data_len);
    }
    if ((iVar1 != 0) && (iVar1 = CBB_flush(cbb), iVar1 != 0)) {
      return 1;
    }
  }
  paVar2 = &cbb->u;
  if (cbb->is_child != '\0') {
    paVar2 = (anon_union_32_2_4f6aaa2e_for_u *)(paVar2->base).buf;
  }
  *(byte *)((long)paVar2 + 0x18) = *(byte *)((long)paVar2 + 0x18) | 2;
  cbb->child = (CBB *)0x0;
  return 0;
}

Assistant:

int CBB_add_asn1_element(CBB *cbb, CBS_ASN1_TAG tag, const uint8_t *data,
                         size_t data_len) {
  CBB child;
  if (!CBB_add_asn1(cbb, &child, tag) ||
      !CBB_add_bytes(&child, data, data_len) ||  //
      !CBB_flush(cbb)) {
    cbb_on_error(cbb);
    return 0;
  }

  return 1;
}